

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transit.cpp
# Opt level: O1

int __thiscall
Vault::Transit::decrypt
          (Transit *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  Client *client;
  reference pvVar4;
  value_type encoded_text;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  json_value local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [8];
  json_value local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_80;
  bool local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  client = *(Client **)ctx;
  Vault::operator+((string *)local_a0,"decrypt/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)out);
  paVar1 = &local_e0.field_2;
  pcVar2 = local_a0 + 0x10;
  if (local_a0 == (undefined1  [8])pcVar2) {
    local_e0.field_2._8_8_ = local_90._8_8_;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)local_a0;
  }
  local_e0.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_e0.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_e0._M_string_length = (size_type)local_98;
  local_98.object = (object_t *)0x0;
  local_90._M_local_buf[0] = '\0';
  local_a0 = (undefined1  [8])pcVar2;
  getUrl((Url *)local_c0,(Transit *)ctx,(Path *)&local_e0);
  HttpConsumer::post((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,client,(Url *)local_c0,(Parameters *)outlen);
  pcVar3 = local_c0 + 0x10;
  if (local_c0 != (undefined1  [8])pcVar3) {
    operator_delete((void *)local_c0,
                    CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_a0,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if (local_60 == true) {
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((input_adapter *)&local_e0,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_80._M_value._M_dataplus._M_p,
               (char *)(local_80._M_value._M_string_length +
                       (long)local_80._M_value._M_dataplus._M_p));
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_c0,(input_adapter *)&local_e0,(parser_callback_t *)&local_58,true);
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_c0,"data");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar4,"plaintext");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_a0,pvVar4);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_c0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_c0 + 8),(value_t)local_c0[0]);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_e0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_a0);
    Base64::decode((string *)local_c0,&local_e0);
    *(Transit **)this = this + 0x10;
    if (local_c0 == (undefined1  [8])pcVar3) {
      *(ulong *)(this + 0x10) =
           CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]);
      *(undefined8 *)(this + 0x18) = local_b0._8_8_;
    }
    else {
      *(undefined1 (*) [8])this = local_c0;
      *(ulong *)(this + 0x10) =
           CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]);
    }
    *(json_value *)(this + 8) = local_b8;
    local_b8.object = (object_t *)0x0;
    local_b0._M_local_buf[0] = '\0';
    this[0x20] = (Transit)0x1;
    local_c0 = (undefined1  [8])pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_a0 + 8),local_a0[0]);
  }
  else {
    this[0x20] = (Transit)0x0;
  }
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  return (int)this;
}

Assistant:

std::optional<std::string>
Vault::Transit::decrypt(const Path &path, const Parameters &parameters) {
  auto response =
      HttpConsumer::post(client_, getUrl(Path{"decrypt/" + path}), parameters);

  if (response) {
    auto encoded_text =
        nlohmann::json::parse(response.value())["data"]["plaintext"];
    return Base64::decode(encoded_text);
  } else {
    return std::nullopt;
  }
}